

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O1

int idr_start(archive_write *a,idr *idr,int cnt,int ffmax,int num_size,int null_size,
             archive_rb_tree_ops *rbt_ops)

{
  bool bVar1;
  int iVar2;
  idrent *piVar3;
  undefined4 in_register_0000008c;
  uint uVar4;
  
  if (idr->pool_size < cnt) {
    uVar4 = cnt + 0x7fU & 0xffffff80;
    piVar3 = (idrent *)realloc(idr->idrent_pool,(long)(int)uVar4 << 6);
    if (piVar3 == (idrent *)0x0) {
      archive_set_error(&a->archive,0xc,"Can\'t allocate memory");
      iVar2 = -0x1e;
      bVar1 = false;
      goto LAB_003df46b;
    }
    idr->idrent_pool = piVar3;
    idr->pool_size = uVar4;
  }
  iVar2 = 0;
  bVar1 = true;
LAB_003df46b:
  if (bVar1) {
    __archive_rb_tree_init
              (&idr->rbtree,(archive_rb_tree_ops *)CONCAT44(in_register_0000008c,null_size));
    (idr->wait_list).first = (idrent *)0x0;
    (idr->wait_list).last = &(idr->wait_list).first;
    idr->pool_idx = 0;
    idr->num_size = ffmax;
    idr->null_size = num_size;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int
idr_start(struct archive_write *a, struct idr *idr, int cnt, int ffmax,
    int num_size, int null_size, const struct archive_rb_tree_ops *rbt_ops)
{
	int r;

	(void)ffmax; /* UNUSED */

	r = idr_ensure_poolsize(a, idr, cnt);
	if (r != ARCHIVE_OK)
		return (r);
	__archive_rb_tree_init(&(idr->rbtree), rbt_ops);
	idr->wait_list.first = NULL;
	idr->wait_list.last = &(idr->wait_list.first);
	idr->pool_idx = 0;
	idr->num_size = num_size;
	idr->null_size = null_size;
	return (ARCHIVE_OK);
}